

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void AM_showSS(void)

{
  subsector_t *psVar1;
  FPolyNode *pFVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  AMColor red;
  AMColor yellow;
  AMColor local_40;
  AMColor local_38;
  
  if ((-1 < am_showsubsector.Value) && (am_showsubsector.Value < numsubsectors)) {
    local_38.RGB = 0xffffff00;
    bVar3 = FColorMatcher::Pick(&ColorMatcher,0xff,0xff,0);
    local_38.Index = (int)bVar3;
    local_40.RGB = 0xffff0000;
    bVar3 = FColorMatcher::Pick(&ColorMatcher,0xff,0,0);
    local_40.Index = (int)bVar3;
    psVar1 = subsectors + am_showsubsector.Value;
    if (subsectors[am_showsubsector.Value].numlines != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        AM_drawSeg((seg_t *)((long)&psVar1->firstline->v1 + lVar6),&local_38);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x48;
      } while (uVar5 < psVar1->numlines);
    }
    PO_LinkToSubsectors();
    if (0 < po_NumPolyobjs) {
      lVar6 = 0;
      iVar4 = po_NumPolyobjs;
      do {
        for (pFVar2 = polyobjs[lVar6].subsectorlinks; pFVar2 != (FPolyNode *)0x0;
            pFVar2 = pFVar2->snext) {
          if ((pFVar2->subsector == psVar1) && ((pFVar2->segs).Count != 0)) {
            lVar7 = 0;
            uVar5 = 0;
            do {
              AM_drawPolySeg((FPolySeg *)((long)&(((pFVar2->segs).Array)->v1).pos.X + lVar7),
                             &local_40);
              uVar5 = uVar5 + 1;
              lVar7 = lVar7 + 0x28;
            } while (uVar5 < (pFVar2->segs).Count);
          }
          iVar4 = po_NumPolyobjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
  }
  return;
}

Assistant:

inline operator int () const { return Value; }